

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Cpu.cpp
# Opt level: O0

void __thiscall Hes_Cpu::reset(Hes_Cpu *this)

{
  long in_RDI;
  
  *(long *)(in_RDI + 0x2018) = in_RDI + 0x2020;
  *(undefined4 *)(in_RDI + 0x206c) = 0;
  *(undefined4 *)(in_RDI + 0x2068) = 0;
  *(undefined4 *)(in_RDI + 0x2070) = 0x40000000;
  *(undefined4 *)(in_RDI + 0x2074) = 0x40000000;
  *(undefined1 *)(in_RDI + 0x2005) = 4;
  *(undefined1 *)(in_RDI + 0x2006) = 0;
  *(undefined2 *)(in_RDI + 0x2000) = 0;
  *(undefined1 *)(in_RDI + 0x2002) = 0;
  *(undefined1 *)(in_RDI + 0x2003) = 0;
  *(undefined1 *)(in_RDI + 0x2004) = 0;
  blargg_verify_byte_order();
  return;
}

Assistant:

void Hes_Cpu::reset()
{
	check( state == &state_ );
	state = &state_;
	
	state_.time = 0;
	state_.base = 0;
	irq_time_   = future_hes_time;
	end_time_   = future_hes_time;
	
	r.status = st_i;
	r.sp     = 0;
	r.pc     = 0;
	r.a      = 0;
	r.x      = 0;
	r.y      = 0;
	
	blargg_verify_byte_order();
}